

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-unwrap.cpp
# Opt level: O0

Rational __thiscall CommandOptions::PictureRate(CommandOptions *this)

{
  CommandOptions *this_local;
  
  if (this->picture_rate == 0x10) {
    this_local = ASDCP::EditRate_16;
  }
  else if (this->picture_rate == 0x12) {
    this_local = ASDCP::EditRate_18;
  }
  else if (this->picture_rate == 0x14) {
    this_local = ASDCP::EditRate_20;
  }
  else if (this->picture_rate == 0x16) {
    this_local = ASDCP::EditRate_22;
  }
  else if (this->picture_rate == 0x17) {
    this_local = ASDCP::EditRate_23_98;
  }
  else if (this->picture_rate == 0x18) {
    this_local = ASDCP::EditRate_24;
  }
  else if (this->picture_rate == 0x19) {
    this_local = ASDCP::EditRate_25;
  }
  else if (this->picture_rate == 0x1e) {
    this_local = ASDCP::EditRate_30;
  }
  else if (this->picture_rate == 0x30) {
    this_local = ASDCP::EditRate_48;
  }
  else if (this->picture_rate == 0x32) {
    this_local = ASDCP::EditRate_50;
  }
  else if (this->picture_rate == 0x3c) {
    this_local = ASDCP::EditRate_60;
  }
  else if (this->picture_rate == 0x60) {
    this_local = ASDCP::EditRate_96;
  }
  else if (this->picture_rate == 100) {
    this_local = ASDCP::EditRate_100;
  }
  else if (this->picture_rate == 0x78) {
    this_local = ASDCP::EditRate_120;
  }
  else if (this->picture_rate == 0xc0) {
    this_local = ASDCP::EditRate_192;
  }
  else if (this->picture_rate == 200) {
    this_local = ASDCP::EditRate_200;
  }
  else if (this->picture_rate == 0xf0) {
    this_local = ASDCP::EditRate_240;
  }
  else {
    this_local = ASDCP::EditRate_24;
  }
  return (Rational)this_local;
}

Assistant:

Rational PictureRate()
  {
    if ( picture_rate == 16 ) return EditRate_16;
    if ( picture_rate == 18 ) return EditRate_18;
    if ( picture_rate == 20 ) return EditRate_20;
    if ( picture_rate == 22 ) return EditRate_22;
    if ( picture_rate == 23 ) return EditRate_23_98;
    if ( picture_rate == 24 ) return EditRate_24;
    if ( picture_rate == 25 ) return EditRate_25;
    if ( picture_rate == 30 ) return EditRate_30;
    if ( picture_rate == 48 ) return EditRate_48;
    if ( picture_rate == 50 ) return EditRate_50;
    if ( picture_rate == 60 ) return EditRate_60;
    if ( picture_rate == 96 ) return EditRate_96;
    if ( picture_rate == 100 ) return EditRate_100;
    if ( picture_rate == 120 ) return EditRate_120;
    if ( picture_rate == 192 ) return EditRate_192;
    if ( picture_rate == 200 ) return EditRate_200;
    if ( picture_rate == 240 ) return EditRate_240;
    return EditRate_24;
  }